

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O2

void __thiscall
amrex::FluxRegister::FineAdd
          (FluxRegister *this,FArrayBox *flux,int dir,int boxno,int srccomp,int destcomp,int numcomp
          ,Real mult,RunOn runon)

{
  Box *pBVar1;
  FArrayBox *pFVar2;
  FArrayBox *pFVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  Dim3 local_100;
  Array4<double> local_f0;
  Array4<const_double> local_b0;
  Array4<double> local_70;
  
  pFVar2 = FabArray<amrex::FArrayBox>::fabPtr
                     ((FabArray<amrex::FArrayBox> *)((this->super_BndryRegister).bndry + dir),boxno)
  ;
  pFVar3 = FabArray<amrex::FArrayBox>::fabPtr
                     ((FabArray<amrex::FArrayBox> *)((this->super_BndryRegister).bndry + (dir + 3)),
                      boxno);
  local_70.p = (pFVar2->super_BaseFab<double>).dptr;
  local_70.ncomp = (pFVar2->super_BaseFab<double>).nvar;
  pBVar1 = &(pFVar2->super_BaseFab<double>).domain;
  local_70.begin.z = (pFVar2->super_BaseFab<double>).domain.smallend.vect[2];
  local_70.begin.x = (pBVar1->smallend).vect[0];
  local_70.begin.y = (pBVar1->smallend).vect[1];
  lVar5 = (long)(pFVar2->super_BaseFab<double>).domain.bigend.vect[1] + 1;
  lVar6 = (long)(pFVar2->super_BaseFab<double>).domain.bigend.vect[0];
  lVar4 = (long)(pFVar2->super_BaseFab<double>).domain.bigend.vect[2] + 1;
  local_70.jstride = (lVar6 - (pBVar1->smallend).vect[0]) + 1;
  local_70.kstride =
       (lVar5 - (pFVar2->super_BaseFab<double>).domain.smallend.vect[1]) * local_70.jstride;
  local_70.nstride = (lVar4 - local_70.begin.z) * local_70.kstride;
  local_70.end._0_8_ = lVar6 + 1U & 0xffffffff | lVar5 << 0x20;
  local_70.end.z = (int)lVar4;
  local_f0.p = (pFVar3->super_BaseFab<double>).dptr;
  local_f0.ncomp = (pFVar3->super_BaseFab<double>).nvar;
  pBVar1 = &(pFVar3->super_BaseFab<double>).domain;
  local_f0.begin.z = (pFVar3->super_BaseFab<double>).domain.smallend.vect[2];
  local_f0.begin.x = (pBVar1->smallend).vect[0];
  local_f0.begin.y = (pBVar1->smallend).vect[1];
  lVar6 = (long)(pFVar3->super_BaseFab<double>).domain.bigend.vect[1] + 1;
  lVar4 = (long)(pFVar3->super_BaseFab<double>).domain.bigend.vect[0];
  local_f0.jstride = (lVar4 - (pBVar1->smallend).vect[0]) + 1;
  lVar5 = (long)(pFVar3->super_BaseFab<double>).domain.bigend.vect[2] + 1;
  local_f0.kstride =
       (lVar6 - (pFVar3->super_BaseFab<double>).domain.smallend.vect[1]) * local_f0.jstride;
  local_f0.nstride = (lVar5 - local_f0.begin.z) * local_f0.kstride;
  local_f0.end._0_8_ = lVar4 + 1U & 0xffffffff | lVar6 << 0x20;
  local_f0.end.z = (int)lVar5;
  local_b0.p = (flux->super_BaseFab<double>).dptr;
  local_b0.ncomp = (flux->super_BaseFab<double>).nvar;
  pBVar1 = &(flux->super_BaseFab<double>).domain;
  local_b0.begin.z = (flux->super_BaseFab<double>).domain.smallend.vect[2];
  local_b0.begin.x = (pBVar1->smallend).vect[0];
  local_b0.begin.y = (pBVar1->smallend).vect[1];
  lVar6 = (long)(flux->super_BaseFab<double>).domain.bigend.vect[0];
  lVar4 = (long)(flux->super_BaseFab<double>).domain.bigend.vect[1] + 1;
  lVar5 = (long)(flux->super_BaseFab<double>).domain.bigend.vect[2] + 1;
  local_b0.jstride = (lVar6 - (pBVar1->smallend).vect[0]) + 1;
  local_b0.kstride =
       (lVar4 - (flux->super_BaseFab<double>).domain.smallend.vect[1]) * local_b0.jstride;
  local_b0.nstride = (lVar5 - local_b0.begin.z) * local_b0.kstride;
  local_b0.end._0_8_ = lVar6 + 1U & 0xffffffff | lVar4 << 0x20;
  local_b0.end.z = (int)lVar5;
  local_100.x = (this->ratio).vect[0];
  local_100.y = (this->ratio).vect[1];
  local_100.z = (this->ratio).vect[2];
  fluxreg_fineadd(&(pFVar2->super_BaseFab<double>).domain,&local_70,destcomp,&local_b0,srccomp,
                  numcomp,dir,&local_100,mult);
  fluxreg_fineadd(&(pFVar3->super_BaseFab<double>).domain,&local_f0,destcomp,&local_b0,srccomp,
                  numcomp,dir,&local_100,mult);
  return;
}

Assistant:

void
FluxRegister::FineAdd (const FArrayBox& flux,
                       int              dir,
                       int              boxno,
                       int              srccomp,
                       int              destcomp,
                       int              numcomp,
                       Real             mult,
                       RunOn            runon) noexcept
{
    BL_ASSERT(srccomp >= 0 && srccomp+numcomp <= flux.nComp());
    BL_ASSERT(destcomp >= 0 && destcomp+numcomp <= ncomp);

    FArrayBox& loreg = bndry[Orientation(dir,Orientation::low)][boxno];
    FArrayBox& hireg = bndry[Orientation(dir,Orientation::high)][boxno];
    const Box& lobox = loreg.box();
    const Box& hibox = hireg.box();

    Array4<Real> loarr = loreg.array();
    Array4<Real> hiarr = hireg.array();
    Array4<Real const> farr = flux.const_array();
    const Dim3 local_ratio = ratio.dim3();

    if ((runon == RunOn::Gpu) && Gpu::inLaunchRegion())
    {
        AMREX_LAUNCH_DEVICE_LAMBDA
        ( lobox, tlobx,
          {
              fluxreg_fineadd(tlobx, loarr, destcomp, farr, srccomp,
                              numcomp, dir, local_ratio, mult);
          },
          hibox, thibx,
          {
              fluxreg_fineadd(thibx, hiarr, destcomp, farr, srccomp,
                              numcomp, dir, local_ratio, mult);
          }
        );
    }
    else
    {
        fluxreg_fineadd(lobox, loarr, destcomp, farr, srccomp,
                        numcomp, dir, local_ratio, mult);
        fluxreg_fineadd(hibox, hiarr, destcomp, farr, srccomp,
                        numcomp, dir, local_ratio, mult);
    }
}